

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command-line.cpp
# Opt level: O1

void printWrap(ostream *os,int leftPad,string *content)

{
  char cVar1;
  size_type sVar2;
  uint uVar3;
  ostream *poVar4;
  ulong uVar5;
  uint uVar6;
  undefined4 uVar7;
  size_type *local_78;
  string pad;
  string nextWord;
  
  sVar2 = content->_M_string_length;
  pad.field_2._8_8_ = &nextWord._M_string_length;
  nextWord._M_dataplus._M_p = (pointer)0x0;
  nextWord._M_string_length._0_1_ = 0;
  local_78 = &pad._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&local_78,(char)leftPad);
  uVar6 = (uint)sVar2;
  if (-1 < (int)uVar6) {
    uVar7 = 0x50 - leftPad;
    uVar5 = 0;
    nextWord.field_2._8_4_ = uVar7;
    do {
      if ((((uVar6 & 0x7fffffff) == uVar5) ||
          (cVar1 = (content->_M_dataplus)._M_p[uVar5], cVar1 == '\n')) || (cVar1 == ' ')) {
        if ((int)uVar7 < (int)(uint)nextWord._M_dataplus._M_p) {
          nextWord.field_2._M_local_buf[0xf] = '\n';
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             (os,nextWord.field_2._M_local_buf + 0xf,1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4,(char *)local_78,(long)pad._M_dataplus._M_p);
          uVar7 = nextWord.field_2._8_4_;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,(char *)pad.field_2._8_8_,(long)nextWord._M_dataplus._M_p);
        uVar3 = ~(uint)nextWord._M_dataplus._M_p;
        if (0 < (int)(uVar7 + uVar3)) {
          nextWord.field_2._M_local_buf[0xf] = ' ';
          std::__ostream_insert<char,std::char_traits<char>>
                    (os,nextWord.field_2._M_local_buf + 0xf,1);
        }
        nextWord._M_dataplus._M_p = (pointer)0x0;
        *(undefined1 *)pad.field_2._8_8_ = 0;
        uVar7 = uVar7 + uVar3;
        if ((content->_M_dataplus)._M_p[uVar5] == '\n') {
          nextWord.field_2._M_local_buf[0xf] = '\n';
          std::__ostream_insert<char,std::char_traits<char>>
                    (os,nextWord.field_2._M_local_buf + 0xf,1);
          uVar7 = nextWord.field_2._8_4_;
        }
      }
      else {
        std::__cxx11::string::push_back((char)&pad + '\x18');
      }
      uVar5 = uVar5 + 1;
    } while (uVar6 + 1 != uVar5);
  }
  if (local_78 != &pad._M_string_length) {
    operator_delete(local_78,pad._M_string_length + 1);
  }
  if ((size_type *)pad.field_2._8_8_ != &nextWord._M_string_length) {
    operator_delete((void *)pad.field_2._8_8_,
                    CONCAT71(nextWord._M_string_length._1_7_,(undefined1)nextWord._M_string_length)
                    + 1);
  }
  return;
}

Assistant:

void printWrap(std::ostream& os, int leftPad, const std::string& content) {
  int len = content.size();
  int space = SCREEN_WIDTH - leftPad;
  std::string nextWord;
  std::string pad(leftPad, ' ');
  for (int i = 0; i <= len; ++i) {
    if (i != len && content[i] != ' ' && content[i] != '\n') {
      nextWord += content[i];
    } else {
      if (static_cast<int>(nextWord.size()) > space) {
        os << '\n' << pad;
        space = SCREEN_WIDTH - leftPad;
      }
      os << nextWord;
      space -= nextWord.size() + 1;
      if (space > 0) {
        os << ' ';
      }
      nextWord.clear();
      if (content[i] == '\n') {
        os << '\n';
        space = SCREEN_WIDTH - leftPad;
      }
    }
  }
}